

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int av1_neg_interleave(int x,int ref,int max)

{
  int iVar1;
  int iVar2;
  int diff;
  int max_local;
  int ref_local;
  int x_local;
  int local_4;
  
  iVar1 = x - ref;
  local_4 = x;
  if (ref != 0) {
    if (ref < max + -1) {
      if (ref * 2 < max) {
        iVar2 = iVar1;
        if (iVar1 < 1) {
          iVar2 = -iVar1;
        }
        if (iVar2 <= ref) {
          if (iVar1 < 1) {
            local_4 = iVar1 * -2;
          }
          else {
            local_4 = iVar1 * 2 + -1;
          }
        }
      }
      else {
        iVar2 = iVar1;
        if (iVar1 < 1) {
          iVar2 = -iVar1;
        }
        if (iVar2 < max - ref) {
          if (iVar1 < 1) {
            local_4 = iVar1 * -2;
          }
          else {
            local_4 = iVar1 * 2 + -1;
          }
        }
        else {
          local_4 = (max - x) + -1;
        }
      }
    }
    else {
      local_4 = (max - x) + -1;
    }
  }
  return local_4;
}

Assistant:

int av1_neg_interleave(int x, int ref, int max) {
  assert(x < max);
  const int diff = x - ref;
  if (!ref) return x;
  if (ref >= (max - 1)) return -x + max - 1;
  if (2 * ref < max) {
    if (abs(diff) <= ref) {
      if (diff > 0)
        return (diff << 1) - 1;
      else
        return ((-diff) << 1);
    }
    return x;
  } else {
    if (abs(diff) < (max - ref)) {
      if (diff > 0)
        return (diff << 1) - 1;
      else
        return ((-diff) << 1);
    }
    return (max - x) - 1;
  }
}